

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

double soplex::LPFreadInfinity<double>(char **pos)

{
  long lVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  double dVar15;
  
  cVar2 = **pos;
  pcVar10 = *pos + 1;
  *pos = pcVar10;
  iVar13 = 0;
  iVar11 = 0;
  do {
    lVar8 = (long)iVar13;
    cVar3 = "inf[inity]"[lVar8];
    if (cVar3 == '[') {
      pcVar5 = "inf[inity]" + (iVar13 + 1);
      lVar12 = 0;
      iVar6 = iVar13;
      do {
        iVar13 = iVar6;
        pcVar14 = pcVar5;
        cVar3 = pcVar10[lVar12 + iVar11];
        iVar7 = tolower((int)cVar3);
        lVar1 = lVar12 + 1;
        if (cVar3 == '\0') break;
        lVar4 = lVar12 + lVar8 + 1;
        pcVar5 = pcVar14 + 1;
        lVar12 = lVar1;
        iVar6 = iVar13 + 1;
      } while (iVar7 == "inf[inity]"[lVar4]);
      do {
        iVar13 = iVar13 + 1;
        cVar3 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      } while (cVar3 != ']');
      iVar11 = iVar11 + (int)lVar1 + -2;
    }
    else {
      if (cVar3 == '\0') {
        bVar9 = pcVar10[iVar11];
        goto LAB_00130f5a;
      }
      bVar9 = pcVar10[iVar11];
      iVar6 = tolower((int)(char)bVar9);
      if (iVar6 != cVar3) {
        if (cVar3 == '\0') {
LAB_00130f5a:
          if (((bVar9 < 0x21) && ((0x100002601U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) ||
             ((byte)(bVar9 - 0x3c) < 3)) {
            *pos = pcVar10 + iVar11;
          }
        }
        ::soplex::infinity::__tls_init();
        dVar15 = *(double *)(in_FS_OFFSET + -8);
        if (cVar2 == '-') {
          dVar15 = -dVar15;
        }
        return dVar15;
      }
    }
    iVar13 = iVar13 + 1;
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

static R LPFreadInfinity(char*& pos)
{
   assert(LPFisInfinity(pos));

   R sense = (*pos == '-') ? -1.0 : 1.0;

   (void) LPFhasKeyword(++pos, "inf[inity]");

   return sense * R(infinity);
}